

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void rtranspose(double *m,int rows,int cols,double *n,int r,int c)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  int iVar4;
  double dVar5;
  
  while ((0x40 < rows || (0x40 < cols))) {
    if (cols < rows) {
      dVar5 = ceil((double)rows * 0.5);
      iVar4 = (int)dVar5;
      rows = rows - iVar4;
      rtranspose(m,iVar4,cols,n,r,c);
      m = m + iVar4 * c;
      n = n + iVar4;
    }
    else {
      dVar5 = ceil((double)cols * 0.5);
      iVar4 = (int)dVar5;
      cols = cols - iVar4;
      rtranspose(m,rows,iVar4,n,r,c);
      m = m + iVar4;
      n = n + iVar4 * r;
    }
  }
  if (0 < rows) {
    uVar1 = 0;
    do {
      if (0 < cols) {
        uVar3 = 0;
        pdVar2 = n;
        do {
          *pdVar2 = m[uVar3];
          uVar3 = uVar3 + 1;
          pdVar2 = pdVar2 + r;
        } while ((uint)cols != uVar3);
      }
      uVar1 = uVar1 + 1;
      m = m + c;
      n = n + 1;
    } while (uVar1 != (uint)rows);
  }
  return;
}

Assistant:

void rtranspose(double *m, int rows, int cols,double *n, int r, int c) {
	register int i,j;
	int rm,cm;
	int rm1,cm1,rm2,cm2;
	int block;

	block = (int) BLOCKSIZE;

	if (rows <= block && cols <= block) {
		for (i = 0; i < rows; ++i) {
			for (j = 0; j < cols; ++j) {
				n[i+j*r] = m[j+i*c];
				//cout << *(n+i+j*r) << " ";
			}
		}
		//cout << endl;

	} else if (cols >= rows) {
		rm = rows;
		cm1 = (int) ceil((double) cols/2.0);
		cm2 = cols - cm1;

		rtranspose(m,rm,cm1,n,r,c);
		rtranspose(m+cm1,rm,cm2,n+cm1*r,r,c);
	} else if (rows > cols) {
		rm1 = (int) ceil((double) rows/2.0);
		rm2 = rows - rm1;
		cm = cols;
		rtranspose(m,rm1,cm,n,r,c);
		rtranspose(m+rm1*c,rm2,cm,n+rm1,r,c);
	}

}